

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall gulps::gulps_print_output::log_message(gulps_print_output *this,message *msg)

{
  color cVar1;
  string_view format;
  string_view format_00;
  format_args args;
  format_args args_00;
  string local_48;
  undefined8 local_28 [2];
  
  if (this->text_only == false) {
    cVar1 = this->hdr_color;
    message::print_message_abi_cxx11_(&local_48,msg,false);
    format.size_ = local_48._M_string_length;
    format.data_ = local_48._M_dataplus._M_p;
    local_28[0] = 0;
    args.
    super_basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
    .field_1.values_ =
         (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
          *)local_28;
    args.
    super_basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
    .types_ = fmt::v5::
              format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
              ::TYPES;
    fmt::v5::vprint_rgb((rgb)((uint3)((ushort)(cVar1 >> 0x10) & 0xff) |
                             (uint3)cVar1 & 0xff00 | (uint3)(cVar1 << 0x10)),format,args);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
  }
  cVar1 = msg->clr;
  message::print_text_abi_cxx11_(&local_48,msg);
  format_00.size_ = local_48._M_string_length;
  format_00.data_ = local_48._M_dataplus._M_p;
  local_28[0] = 0;
  args_00.
  super_basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  .field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)local_28;
  args_00.
  super_basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  .types_ = fmt::v5::
            format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ::TYPES;
  fmt::v5::vprint_rgb((rgb)((uint3)((ushort)(cVar1 >> 0x10) & 0xff) |
                           (uint3)cVar1 & 0xff00 | (uint3)(cVar1 << 0x10)),format_00,args_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return;
}

Assistant:

void log_message(const message& msg) override
		{
			if(!text_only)
				fmt::print(hdr_color, msg.print_message(false));
			fmt::print(msg.clr, msg.print_text());
		}